

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcDivisor.c
# Opt level: O1

Mvc_Cover_t * Mvc_CoverDivisor(Mvc_Cover_t *pCover)

{
  int iVar1;
  Mvc_Cover_t *pCover_00;
  
  iVar1 = Mvc_CoverReadCubeNum(pCover);
  pCover_00 = (Mvc_Cover_t *)0x0;
  if (1 < iVar1) {
    iVar1 = Mvc_CoverAnyLiteral(pCover,(Mvc_Cube_t *)0x0);
    if (iVar1 != -1) {
      pCover_00 = Mvc_CoverDup(pCover);
      Mvc_CoverDivisorZeroKernel(pCover_00);
      iVar1 = Mvc_CoverReadCubeNum(pCover_00);
      if (iVar1 == 0) {
        __assert_fail("Mvc_CoverReadCubeNum(pKernel)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcDivisor.c"
                      ,0x3a,"Mvc_Cover_t *Mvc_CoverDivisor(Mvc_Cover_t *)");
      }
    }
  }
  return pCover_00;
}

Assistant:

Mvc_Cover_t * Mvc_CoverDivisor( Mvc_Cover_t * pCover )
{
    Mvc_Cover_t * pKernel;
    if ( Mvc_CoverReadCubeNum(pCover) <= 1 )
        return NULL;
    // allocate the literal array and count literals
    if ( Mvc_CoverAnyLiteral( pCover, NULL ) == -1 )
        return NULL;
    // duplicate the cover
    pKernel = Mvc_CoverDup(pCover);
    // perform the kerneling
    Mvc_CoverDivisorZeroKernel( pKernel );
    assert( Mvc_CoverReadCubeNum(pKernel) );
    return pKernel;
}